

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O2

int __thiscall basisu::huffman_encoding_table::init(huffman_encoding_table *this,EVP_PKEY_CTX *ctx)

{
  uint8_vec *this_00;
  byte bVar1;
  ushort uVar2;
  uint32_t i;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  sym_freq *A;
  size_type sVar6;
  uchar *puVar7;
  byte *pbVar8;
  unsigned_short *puVar9;
  uint in_ECX;
  uint uVar10;
  ulong uVar11;
  long in_RDX;
  int iVar12;
  ulong new_size_size_t;
  uint32_t i_2;
  uint32_t uVar13;
  size_type __n;
  bool bVar14;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq0;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq1;
  int num_codes [32];
  uint32_t next_code [32];
  
  __n = 0;
  iVar12 = 0;
  if (0xffffbfff < (int)ctx - 0x4001U && in_ECX < 0x11) {
    new_size_size_t = (ulong)ctx & 0xffffffff;
    for (uVar4 = 0; uVar13 = (uint32_t)__n, new_size_size_t != uVar4; uVar4 = uVar4 + 1) {
      __n = (size_type)((uVar13 + 1) - (uint)(*(short *)(in_RDX + uVar4 * 2) == 0));
    }
    if (uVar13 == 0) {
      iVar12 = 0;
    }
    else {
      std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                (&sym_freq0,__n,(allocator_type *)num_codes);
      std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                (&sym_freq1,__n,(allocator_type *)num_codes);
      uVar4 = 0;
      for (uVar5 = 0; new_size_size_t != uVar5; uVar5 = uVar5 + 1) {
        uVar2 = *(ushort *)(in_RDX + uVar5 * 2);
        uVar11 = uVar4;
        if (uVar2 != 0) {
          sym_freq0.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4].m_key = (uint)uVar2;
          uVar11 = (ulong)((int)uVar4 + 1);
          sym_freq0.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4].m_sym_index = (uint16_t)uVar5;
        }
        uVar4 = uVar11;
      }
      A = canonical_huffman_radix_sort_syms
                    (uVar13,sym_freq0.
                            super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                     sym_freq1.
                     super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl
                     .super__Vector_impl_data._M_start);
      canonical_huffman_calculate_minimum_redundancy(A,uVar13);
      num_codes[0x1c] = 0;
      num_codes[0x1d] = 0;
      num_codes[0x1e] = 0;
      num_codes[0x1f] = 0;
      num_codes[0x18] = 0;
      num_codes[0x19] = 0;
      num_codes[0x1a] = 0;
      num_codes[0x1b] = 0;
      num_codes[0x14] = 0;
      num_codes[0x15] = 0;
      num_codes[0x16] = 0;
      num_codes[0x17] = 0;
      num_codes[0x10] = 0;
      num_codes[0x11] = 0;
      num_codes[0x12] = 0;
      num_codes[0x13] = 0;
      num_codes[0xc] = 0;
      num_codes[0xd] = 0;
      num_codes[0xe] = 0;
      num_codes[0xf] = 0;
      num_codes[8] = 0;
      num_codes[9] = 0;
      num_codes[10] = 0;
      num_codes[0xb] = 0;
      num_codes[4] = 0;
      num_codes[5] = 0;
      num_codes[6] = 0;
      num_codes[7] = 0;
      num_codes[0] = 0;
      num_codes[1] = 0;
      num_codes[2] = 0;
      num_codes[3] = 0;
      for (sVar6 = 0; __n != sVar6; sVar6 = sVar6 + 1) {
        if (0x1f < (ulong)A[sVar6].m_key) {
          iVar12 = 0;
          goto LAB_0021d405;
        }
        num_codes[A[sVar6].m_key] = num_codes[A[sVar6].m_key] + 1;
      }
      canonical_huffman_enforce_max_code_size(num_codes,uVar13,in_ECX);
      this_00 = &this->m_code_sizes;
      vector<unsigned_char>::resize(this_00,0,false);
      vector<unsigned_char>::resize(this_00,new_size_size_t,false);
      vector<unsigned_short>::resize(&this->m_codes,0,false);
      vector<unsigned_short>::resize(&this->m_codes,new_size_size_t,false);
      for (uVar4 = 1; uVar4 != in_ECX + 1; uVar4 = uVar4 + 1) {
        iVar12 = num_codes[uVar4];
        while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
          __n = (size_type)((int)__n - 1);
          puVar7 = vector<unsigned_char>::operator[](this_00,(ulong)A[__n].m_sym_index);
          *puVar7 = (uchar)uVar4;
        }
      }
      next_code[1] = 0;
      uVar13 = 0;
      for (uVar4 = 2; uVar4 <= in_ECX; uVar4 = uVar4 + 1) {
        uVar13 = (uVar13 + num_codes[uVar4 - 1]) * 2;
        next_code[uVar4] = uVar13;
      }
      for (uVar4 = 0; uVar4 != new_size_size_t; uVar4 = uVar4 + 1) {
        pbVar8 = vector<unsigned_char>::operator[](this_00,uVar4);
        bVar1 = *pbVar8;
        uVar3 = (uint)bVar1;
        if (bVar1 != 0) {
          if (0x1f < bVar1) break;
          uVar10 = next_code[bVar1];
          next_code[bVar1] = uVar10 + 1;
          iVar12 = 0;
          while (bVar14 = uVar3 != 0, uVar3 = uVar3 - 1, bVar14) {
            iVar12 = (uVar10 & 1) + iVar12 * 2;
            uVar10 = uVar10 >> 1;
          }
          puVar9 = vector<unsigned_short>::operator[](&this->m_codes,uVar4);
          *puVar9 = (unsigned_short)iVar12;
        }
      }
      iVar12 = (int)CONCAT71((int7)(uVar4 >> 8),new_size_size_t <= uVar4);
LAB_0021d405:
      std::_Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::~_Vector_base
                (&sym_freq1.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>)
      ;
      std::_Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::~_Vector_base
                (&sym_freq0.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>)
      ;
    }
  }
  return iVar12;
}

Assistant:

bool huffman_encoding_table::init(uint32_t num_syms, const uint16_t *pFreq, uint32_t max_code_size)
	{
		if (max_code_size > cHuffmanMaxSupportedCodeSize)
			return false;
		if ((!num_syms) || (num_syms > cHuffmanMaxSyms))
			return false;

		uint32_t total_used_syms = 0;
		for (uint32_t i = 0; i < num_syms; i++)
			if (pFreq[i])
				total_used_syms++;

		if (!total_used_syms)
			return false;

		std::vector<sym_freq> sym_freq0(total_used_syms), sym_freq1(total_used_syms);
		for (uint32_t i = 0, j = 0; i < num_syms; i++)
		{
			if (pFreq[i])
			{
				sym_freq0[j].m_key = pFreq[i];
				sym_freq0[j++].m_sym_index = static_cast<uint16_t>(i);
			}
		}

		sym_freq *pSym_freq = canonical_huffman_radix_sort_syms(total_used_syms, &sym_freq0[0], &sym_freq1[0]);

		canonical_huffman_calculate_minimum_redundancy(pSym_freq, total_used_syms);

		int num_codes[cHuffmanMaxSupportedInternalCodeSize + 1];
		clear_obj(num_codes);

		for (uint32_t i = 0; i < total_used_syms; i++)
		{
			if (pSym_freq[i].m_key > cHuffmanMaxSupportedInternalCodeSize)
				return false;

			num_codes[pSym_freq[i].m_key]++;
		}

		canonical_huffman_enforce_max_code_size(num_codes, total_used_syms, max_code_size);

		m_code_sizes.resize(0);
		m_code_sizes.resize(num_syms);

		m_codes.resize(0);
		m_codes.resize(num_syms);

		for (uint32_t i = 1, j = total_used_syms; i <= max_code_size; i++)
			for (uint32_t l = num_codes[i]; l > 0; l--)
				m_code_sizes[pSym_freq[--j].m_sym_index] = static_cast<uint8_t>(i);

		uint32_t next_code[cHuffmanMaxSupportedInternalCodeSize + 1];

		next_code[1] = 0;
		for (uint32_t j = 0, i = 2; i <= max_code_size; i++)
			next_code[i] = j = ((j + num_codes[i - 1]) << 1);

		for (uint32_t i = 0; i < num_syms; i++)
		{
			uint32_t rev_code = 0, code, code_size;
			if ((code_size = m_code_sizes[i]) == 0)
				continue;
			if (code_size > cHuffmanMaxSupportedInternalCodeSize)
				return false;
			code = next_code[code_size]++;
			for (uint32_t l = code_size; l > 0; l--, code >>= 1)
				rev_code = (rev_code << 1) | (code & 1);
			m_codes[i] = static_cast<uint16_t>(rev_code);
		}

		return true;
	}